

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

value_and_holder * __thiscall
pybind11::detail::instance::get_value_and_holder
          (value_and_holder *__return_storage_ptr__,instance *this,type_info *find_type)

{
  char *pcVar1;
  bool bVar2;
  value_and_holder *pvVar3;
  allocator local_161;
  string local_160 [55];
  allocator local_129;
  string local_128 [32];
  char local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  iterator local_88;
  undefined1 local_58 [8];
  iterator it;
  values_and_holders vhs;
  type_info *find_type_local;
  instance *this_local;
  
  if ((find_type == (type_info *)0x0) || ((this->ob_base).ob_type == find_type->type)) {
    value_and_holder::value_and_holder(__return_storage_ptr__,this,find_type,0,0);
  }
  else {
    values_and_holders::values_and_holders((values_and_holders *)&it.curr.vh,this);
    values_and_holders::find((iterator *)local_58,(values_and_holders *)&it.curr.vh,find_type);
    values_and_holders::end(&local_88,(values_and_holders *)&it.curr.vh);
    bVar2 = values_and_holders::iterator::operator!=((iterator *)local_58,&local_88);
    if (!bVar2) {
      pcVar1 = find_type->type->tp_name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,pcVar1,&local_129);
      std::operator+(local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "pybind11::detail::instance::get_value_and_holder: `");
      std::operator+(local_e8,local_108);
      pcVar1 = ((this->ob_base).ob_type)->tp_name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,pcVar1,&local_161);
      std::operator+(local_c8,local_e8);
      std::operator+(local_a8,(char *)local_c8);
      pybind11_fail(local_a8);
    }
    pvVar3 = values_and_holders::iterator::operator*((iterator *)local_58);
    __return_storage_ptr__->inst = pvVar3->inst;
    __return_storage_ptr__->index = pvVar3->index;
    __return_storage_ptr__->type = pvVar3->type;
    __return_storage_ptr__->vh = pvVar3->vh;
  }
  return __return_storage_ptr__;
}

Assistant:

PYBIND11_NOINLINE inline value_and_holder instance::get_value_and_holder(const type_info *find_type /*= nullptr default in common.h*/) {
    // Optimize common case:
    if (!find_type || Py_TYPE(this) == find_type->type)
        return value_and_holder(this, find_type, 0, 0);

    detail::values_and_holders vhs(this);
    auto it = vhs.find(find_type);
    if (it != vhs.end())
        return *it;

#if defined(NDEBUG)
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: "
            "type is not a pybind11 base of the given instance "
            "(compile in debug mode for type details)");
#else
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: `" +
            std::string(find_type->type->tp_name) + "' is not a pybind11 base of the given `" +
            std::string(Py_TYPE(this)->tp_name) + "' instance");
#endif
}